

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GayBerneAdapter.cpp
# Opt level: O0

void __thiscall
OpenMD::GayBerneAdapter::makeGayBerne
          (GayBerneAdapter *this,RealType d,RealType l,RealType eps_X,RealType eps_S,RealType eps_E,
          RealType dw)

{
  bool bVar1;
  undefined8 *in_RDI;
  AtomType *in_XMM4_Qa;
  shared_ptr<OpenMD::GenericData> *in_XMM5_Qa;
  GBAtypeParameters gbParam;
  string *in_stack_ffffffffffffff48;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>_> *__r;
  AtomType *in_stack_ffffffffffffff50;
  shared_ptr<OpenMD::GenericData> *this_00;
  GBAtypeParameters *in_stack_ffffffffffffff70;
  element_type *in_stack_ffffffffffffff78;
  
  bVar1 = isGayBerne((GayBerneAdapter *)0x2bca47);
  if (bVar1) {
    AtomType::removeProperty(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  this_00 = (shared_ptr<OpenMD::GenericData> *)*in_RDI;
  __r = (shared_ptr<OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>_> *)&stack0xffffffffffffff78;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>,std::__cxx11::string_const&,OpenMD::GBAtypeParameters&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>,void>(this_00,__r);
  AtomType::addProperty(in_XMM4_Qa,in_XMM5_Qa);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x2bcb22);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>_> *)0x2bcb2c);
  return;
}

Assistant:

void GayBerneAdapter::makeGayBerne(RealType d, RealType l, RealType eps_X,
                                     RealType eps_S, RealType eps_E,
                                     RealType dw) {
    if (isGayBerne()) { at_->removeProperty(GBtypeID); }

    GBAtypeParameters gbParam {};
    gbParam.GB_d     = d;
    gbParam.GB_l     = l;
    gbParam.GB_eps_X = eps_X;
    gbParam.GB_eps_S = eps_S;
    gbParam.GB_eps_E = eps_E;
    gbParam.GB_dw    = dw;

    at_->addProperty(std::make_shared<GBAtypeData>(GBtypeID, gbParam));
  }